

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> absl::PowFive(uint64_t num,int expfive)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  type tVar2;
  byte bVar3;
  int in_ESI;
  int shift;
  uint32_t powers_of_five [13];
  pair<unsigned_long,_unsigned_long> result;
  pair<unsigned_long,_unsigned_long> local_88;
  undefined1 local_78 [28];
  uint32_t in_stack_ffffffffffffffa4;
  pair<unsigned_long,_unsigned_long> in_stack_ffffffffffffffa8;
  pair<unsigned_long,_unsigned_long> local_30;
  int local_20;
  int local_1c;
  unsigned_long local_18;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_20 = 0;
  local_1c = in_ESI;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_int,_true>
            (&local_10,&local_18,&local_20);
  for (; 0xc < local_1c; local_1c = local_1c + -0xd) {
    local_30 = Mul32(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    std::pair<unsigned_long,_unsigned_long>::operator=(&local_10,&local_30);
  }
  memcpy(local_78,&DAT_0081db90,0x34);
  local_88 = Mul32(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  std::pair<unsigned_long,_unsigned_long>::operator=(&local_10,&local_88);
  tVar2 = countl_zero<unsigned_long>(local_10.first);
  if (tVar2 != 0) {
    bVar3 = (byte)tVar2;
    local_10.first = (local_10.first << (bVar3 & 0x3f)) + (local_10.second >> (0x40 - bVar3 & 0x3f))
    ;
    local_10.second = local_10.second << (bVar3 & 0x3f);
  }
  pVar1.second = local_10.second;
  pVar1.first = local_10.first;
  return pVar1;
}

Assistant:

static std::pair<uint64_t, uint64_t> PowFive(uint64_t num, int expfive) {
  std::pair<uint64_t, uint64_t> result = {num, 0};
  while (expfive >= 13) {
    // 5^13 is the highest power of five that will fit in a 32-bit integer.
    result = Mul32(result, 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5);
    expfive -= 13;
  }
  constexpr uint32_t powers_of_five[13] = {
      1,
      5,
      5 * 5,
      5 * 5 * 5,
      5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5};
  result = Mul32(result, powers_of_five[expfive & 15]);
  int shift = countl_zero(result.first);
  if (shift != 0) {
    result.first = (result.first << shift) + (result.second >> (64 - shift));
    result.second = (result.second << shift);
  }
  return result;
}